

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

FProduction * ProdAddStr(FStringProd *prod1,FStringProd *prod2)

{
  size_t sVar1;
  size_t sVar2;
  FStringProd *pFVar3;
  FStringProd *prod;
  size_t len;
  FStringProd *prod2_local;
  FStringProd *prod1_local;
  
  sVar1 = strlen(prod1->Value);
  sVar2 = strlen(prod2->Value);
  pFVar3 = NewStringProd(sVar1 + sVar2 + 1);
  strcpy(pFVar3->Value,prod1->Value);
  strcat(pFVar3->Value,prod2->Value);
  return &pFVar3->super_FProduction;
}

Assistant:

FProduction *ProdAddStr (FStringProd *prod1, FStringProd *prod2)
{
	size_t len = strlen (prod1->Value) + strlen (prod2->Value) + 1;
	FStringProd *prod = NewStringProd (len);
	strcpy (prod->Value, prod1->Value);
	strcat (prod->Value, prod2->Value);
	return prod;
}